

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int imm_move_p(MIR_insn_t insn)

{
  byte bVar1;
  
  if ((((*(uint *)&insn->field_0x18 & 0xfffffffc) == 0) && (insn->ops[0].field_0x8 == '\x02')) &&
     (0x21 < insn->ops[0].u.reg)) {
    bVar1 = *(byte *)&insn[1].insn_link.prev;
    if ((ushort)(bVar1 - 3) < 5) {
      return 1;
    }
    return (uint)(bVar1 == 8);
  }
  return 0;
}

Assistant:

static int imm_move_p (MIR_insn_t insn) {
  return (move_code_p (insn->code) && insn->ops[0].mode == MIR_OP_VAR
          && insn->ops[0].u.var > MAX_HARD_REG
          && (insn->ops[1].mode == MIR_OP_INT || insn->ops[1].mode == MIR_OP_UINT
              || insn->ops[1].mode == MIR_OP_FLOAT || insn->ops[1].mode == MIR_OP_DOUBLE
              || insn->ops[1].mode == MIR_OP_LDOUBLE || insn->ops[1].mode == MIR_OP_REF));
}